

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O3

void If_ManComputeRequired(If_Man_t *p)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  uint *puVar5;
  void **ppvVar6;
  long lVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  If_Par_t *pIVar10;
  long lVar11;
  uint iCo;
  uint uVar12;
  char *in_RSI;
  char *pcVar13;
  If_Man_t *pIVar14;
  Tim_Man_t *p_00;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  If_ManMarkMapping(p);
  if (p->pManTim == (Tim_Man_t *)0x0) {
    pfVar4 = p->pPars->pTimesReq;
    if ((pfVar4 == (float *)0x0) || (p->pPars->fAreaOnly != 0)) {
      in_RSI = (char *)0x0;
      pIVar14 = p;
      fVar18 = If_ManDelayMax(p,0);
      p->RequiredGlo = fVar18;
      pIVar10 = p->pPars;
      if ((pIVar10->nRelaxRatio != 0) &&
         ((pIVar10->DelayTargetNew == 0.0 && (!NAN(pIVar10->DelayTargetNew))))) {
        pIVar10->DelayTargetNew = (((float)pIVar10->nRelaxRatio + 100.0) * fVar18) / 100.0;
      }
      fVar19 = pIVar10->DelayTarget;
      if ((fVar19 != -1.0) || (NAN(fVar19))) {
        if (fVar18 <= fVar19 + p->fEpsilon) {
          if (fVar18 < fVar19 - p->fEpsilon) {
            if (p->fNextRound == 0) {
              p->fNextRound = 1;
            }
            p->RequiredGlo = fVar19;
          }
        }
        else if (p->fNextRound == 0) {
          p->fNextRound = 1;
          in_RSI = "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n";
          Abc_Print((int)pIVar14,
                    "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                    (double)fVar19);
          pIVar10 = p->pPars;
        }
      }
      else if (0.0 < pIVar10->DelayTargetNew) {
        p->RequiredGlo = pIVar10->DelayTargetNew;
      }
      if (pIVar10->fAreaOnly != 0) {
        return;
      }
      if (pIVar10->fDoAverage == 0) {
        if (pIVar10->fLatchPaths == 0) {
          lVar17 = (long)p->vCos->nSize;
          if (0 < lVar17) {
            ppvVar6 = p->vCos->pArray;
            fVar18 = p->RequiredGlo;
            lVar11 = 0;
            do {
              in_RSI = *(char **)((long)ppvVar6[lVar11] + 0x18);
              ((If_Obj_t *)in_RSI)->Required = fVar18;
              lVar11 = lVar11 + 1;
            } while (lVar17 != lVar11);
          }
        }
        else {
          uVar12 = p->nObjs[3] - pIVar10->nLatchesCo;
          pVVar9 = p->vCos;
          iVar3 = pVVar9->nSize;
          if ((int)uVar12 < iVar3) {
            in_RSI = (char *)(ulong)uVar12;
            do {
              if ((int)uVar12 < 0) goto LAB_003b8bd2;
              *(float *)(*(long *)((long)pVVar9->pArray[(long)in_RSI] + 0x18) + 0x34) =
                   p->RequiredGlo;
              in_RSI = (char *)((long)in_RSI + 1);
            } while ((int)in_RSI < iVar3);
          }
        }
      }
      else {
        iVar3 = pIVar10->nRelaxRatio;
        pVVar9 = p->vCos;
        uVar12 = pVVar9->nSize;
        if (iVar3 == 0) {
          if (0 < (int)uVar12) {
            ppvVar6 = pVVar9->pArray;
            uVar16 = 0;
            do {
              in_RSI = *(char **)((long)ppvVar6[uVar16] + 0x18);
              ((If_Obj_t *)in_RSI)->Required = (((If_Obj_t *)in_RSI)->CutBest).Delay;
              uVar16 = uVar16 + 1;
            } while (uVar12 != uVar16);
          }
        }
        else if (0 < (int)uVar12) {
          ppvVar6 = pVVar9->pArray;
          uVar16 = 0;
          do {
            in_RSI = *(char **)((long)ppvVar6[uVar16] + 0x18);
            ((If_Obj_t *)in_RSI)->Required =
                 ((((If_Obj_t *)in_RSI)->CutBest).Delay * ((float)iVar3 + 100.0)) / 100.0;
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
      }
    }
    else {
      lVar17 = (long)p->vCos->nSize;
      if (0 < lVar17) {
        in_RSI = (char *)p->vCos->pArray;
        fVar18 = p->fEpsilon;
        lVar11 = 0;
        uVar16 = 0;
        do {
          lVar7 = *(long *)(*(long *)(&((If_Obj_t *)in_RSI)->field_0x0 + lVar11 * 8) + 0x18);
          fVar19 = *(float *)(lVar7 + 0x5c);
          fVar1 = pfVar4[lVar11];
          fVar20 = fVar1 + fVar18;
          fVar2 = fVar19;
          if (fVar19 <= fVar20) {
            fVar2 = fVar1;
          }
          uVar12 = (int)uVar16 + (uint)(fVar20 < fVar19);
          uVar16 = (ulong)uVar12;
          *(float *)(lVar7 + 0x34) = fVar2;
          lVar11 = lVar11 + 1;
        } while (lVar17 != lVar11);
        if ((uVar12 != 0) && (p->fReqTimeWarn == 0)) {
          pcVar13 = "s";
          if (uVar12 == 1) {
            pcVar13 = "";
          }
          in_RSI = 
          "Required times are exceeded at %d output%s. The earliest arrival times are used.\n";
          Abc_Print((int)lVar11,
                    "Required times are exceeded at %d output%s. The earliest arrival times are used.\n"
                    ,uVar16,pcVar13);
          p->fReqTimeWarn = 1;
        }
      }
    }
    pVVar9 = p->vObjsRev;
    if (0 < pVVar9->nSize) {
      lVar17 = 0;
      do {
        pvVar8 = pVVar9->pArray[lVar17];
        if (*(int *)((long)pvVar8 + 0xc) != 0) {
          If_CutPropagateRequired
                    (p,(If_Obj_t *)in_RSI,(If_Cut_t *)((long)pvVar8 + 0x50),
                     *(float *)((long)pvVar8 + 0x34));
          pVVar9 = p->vObjsRev;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < pVVar9->nSize);
    }
  }
  else {
    pcVar13 = (char *)0x0;
    pIVar14 = p;
    fVar18 = If_ManDelayMax(p,0);
    p->RequiredGlo = fVar18;
    pIVar10 = p->pPars;
    if (((pIVar10->nRelaxRatio != 0) && (pIVar10->DelayTargetNew == 0.0)) &&
       (!NAN(pIVar10->DelayTargetNew))) {
      pIVar10->DelayTargetNew = (((float)pIVar10->nRelaxRatio + 100.0) * fVar18) / 100.0;
    }
    fVar19 = pIVar10->DelayTarget;
    if ((fVar19 != -1.0) || (NAN(fVar19))) {
      if (fVar18 <= fVar19 + p->fEpsilon) {
        if (fVar18 < fVar19 - p->fEpsilon) {
          if (p->fNextRound == 0) {
            p->fNextRound = 1;
          }
          p->RequiredGlo = fVar19;
        }
      }
      else if (p->fNextRound == 0) {
        p->fNextRound = 1;
        pcVar13 = "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n";
        Abc_Print((int)pIVar14,
                  "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                  (double)fVar19);
        pIVar10 = p->pPars;
      }
    }
    else if (0.0 < pIVar10->DelayTargetNew) {
      p->RequiredGlo = pIVar10->DelayTargetNew;
    }
    if (pIVar10->fAreaOnly == 0) {
      Tim_ManIncrementTravId(p->pManTim);
      if (p->vCoAttrs == (Vec_Int_t *)0x0) {
        pIVar10 = p->pPars;
        if (pIVar10->fDoAverage == 0) {
          if (pIVar10->fLatchPaths == 0) {
            Tim_ManInitPoRequiredAll(p->pManTim,p->RequiredGlo);
          }
          else {
            uVar12 = pIVar10->nLatchesCoBox;
            uVar15 = p->nObjs[3] - pIVar10->nLatchesCo;
            iCo = uVar12;
            if ((int)uVar12 < (int)uVar15) {
              do {
                if (((int)uVar12 < 0) || (p->vCos->nSize <= (int)iCo)) goto LAB_003b8bd2;
                pcVar13 = (char *)(ulong)iCo;
                Tim_ManSetCoRequired(p->pManTim,iCo,1e+20);
                iCo = iCo + 1;
                uVar15 = p->nObjs[3] - p->pPars->nLatchesCo;
              } while ((int)iCo < (int)uVar15);
            }
            uVar12 = uVar15;
            if ((int)uVar15 < p->vCos->nSize) {
              do {
                pcVar13 = (char *)(ulong)uVar12;
                if ((int)uVar15 < 0) {
LAB_003b8bd2:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                Tim_ManSetCoRequired(p->pManTim,uVar12,p->RequiredGlo);
                uVar12 = uVar12 + 1;
              } while ((int)uVar12 < p->vCos->nSize);
            }
          }
        }
        else {
          pVVar9 = p->vCos;
          if (pIVar10->nRelaxRatio == 0) {
            if (0 < pVVar9->nSize) {
              uVar16 = 0;
              do {
                pcVar13 = (char *)(uVar16 & 0xffffffff);
                Tim_ManSetCoRequired
                          (p->pManTim,(int)uVar16,
                           *(float *)(*(long *)((long)pVVar9->pArray[uVar16] + 0x18) + 0x5c));
                uVar16 = uVar16 + 1;
                pVVar9 = p->vCos;
              } while ((long)uVar16 < (long)pVVar9->nSize);
            }
          }
          else if (0 < pVVar9->nSize) {
            uVar16 = 0;
            do {
              pcVar13 = (char *)(uVar16 & 0xffffffff);
              Tim_ManSetCoRequired
                        (p->pManTim,(int)uVar16,
                         (((float)p->pPars->nRelaxRatio + 100.0) *
                         *(float *)(*(long *)((long)pVVar9->pArray[uVar16] + 0x18) + 0x5c)) / 100.0)
              ;
              uVar16 = uVar16 + 1;
              pVVar9 = p->vCos;
            } while ((long)uVar16 < (long)pVVar9->nSize);
          }
        }
      }
      else {
        if (p->nObjs[3] != p->vCoAttrs->nSize) {
          __assert_fail("If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                        ,0x1c3,"void If_ManComputeRequired(If_Man_t *)");
        }
        pVVar9 = p->vCos;
        if (0 < pVVar9->nSize) {
          uVar16 = 0;
          do {
            if ((long)p->vCoAttrs->nSize <= (long)uVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            switch(p->vCoAttrs->pArray[uVar16]) {
            case 0:
              p_00 = p->pManTim;
              fVar18 = p->RequiredGlo;
              break;
            case 1:
              p_00 = p->pManTim;
              fVar18 = *(float *)(*(long *)((long)pVVar9->pArray[uVar16] + 0x18) + 0x5c);
              break;
            case 2:
              p_00 = p->pManTim;
              fVar18 = 1e+20;
              break;
            case -1:
              goto switchD_003b86e9_caseD_ffffffff;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                            ,0x1ce,"void If_ManComputeRequired(If_Man_t *)");
            }
            pcVar13 = (char *)(uVar16 & 0xffffffff);
            Tim_ManSetCoRequired(p_00,(int)uVar16,fVar18);
switchD_003b86e9_caseD_ffffffff:
            uVar16 = uVar16 + 1;
            pVVar9 = p->vCos;
          } while ((long)uVar16 < (long)pVVar9->nSize);
        }
      }
      pVVar9 = p->vObjsRev;
      if (0 < pVVar9->nSize) {
        lVar17 = 0;
        do {
          puVar5 = (uint *)pVVar9->pArray[lVar17];
          switch(*puVar5 & 0xf) {
          case 1:
            break;
          case 2:
            pcVar13 = (char *)(ulong)puVar5[2];
            Tim_ManSetCiRequired(p->pManTim,puVar5[2],(float)puVar5[0xd]);
            break;
          case 3:
            pcVar13 = (char *)(ulong)puVar5[2];
            fVar19 = Tim_ManGetCoRequired(p->pManTim,puVar5[2]);
            fVar18 = *(float *)(*(long *)(puVar5 + 6) + 0x34);
            if (fVar18 <= fVar19) {
              fVar19 = fVar18;
            }
            *(float *)(*(long *)(puVar5 + 6) + 0x34) = fVar19;
            break;
          case 4:
            if (puVar5[3] != 0) {
              If_CutPropagateRequired
                        (p,(If_Obj_t *)pcVar13,(If_Cut_t *)(puVar5 + 0x14),(float)puVar5[0xd]);
            }
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                          ,0x202,"void If_ManComputeRequired(If_Man_t *)");
          }
          lVar17 = lVar17 + 1;
          pVVar9 = p->vObjsRev;
        } while (lVar17 < pVVar9->nSize);
      }
    }
  }
  return;
}

Assistant:

void If_ManComputeRequired( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter;
    float reqTime;

    // compute area, clean required times, collect nodes used in the mapping
//    p->AreaGlo = If_ManScanMapping( p );
    If_ManMarkMapping( p );
    if ( p->pManTim == NULL )
    {
        // consider the case when the required times are given
        if ( p->pPars->pTimesReq && !p->pPars->fAreaOnly )
        {
            // make sure that the required time hold
            Counter = 0;
            If_ManForEachCo( p, pObj, i )
            {
                if ( If_ObjArrTime(If_ObjFanin0(pObj)) > p->pPars->pTimesReq[i] + p->fEpsilon )
                {
                    If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                    Counter++;
    //                Abc_Print( 0, "Required times are violated for output %d (arr = %d; req = %d).\n", 
    //                    i, (int)If_ObjArrTime(If_ObjFanin0(pObj)), (int)p->pPars->pTimesReq[i] );
                }
                else
                    If_ObjFanin0(pObj)->Required = p->pPars->pTimesReq[i];
            }
            if ( Counter && !p->fReqTimeWarn )
            {
                Abc_Print( 0, "Required times are exceeded at %d output%s. The earliest arrival times are used.\n", Counter, Counter > 1 ? "s":"" );
                p->fReqTimeWarn = 1;
            }
        }
        else
        {
            // get the global required times
            p->RequiredGlo = If_ManDelayMax( p, 0 );

            // find new delay target
            if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
                p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

            // update the required times according to the target
            if ( p->pPars->DelayTarget != -1 )
            {
                if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
                        Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                    }
                }
                else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
//                        Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                    }
                    p->RequiredGlo = p->pPars->DelayTarget;
                }
            }
            else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
                p->RequiredGlo = p->pPars->DelayTargetNew;
            // do not propagate required times if area minimization is requested
            if ( p->pPars->fAreaOnly ) 
                return;
            // set the required times for the POs
            if ( p->pPars->fDoAverage )
            {
                if ( p->pPars->nRelaxRatio )
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0;
                }
                else
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                }
            }
            else if ( p->pPars->fLatchPaths )
            {
                If_ManForEachLatchInput( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
            else 
            {
                If_ManForEachCo( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
        }
        // go through the nodes in the reverse topological order
    //    Vec_PtrForEachEntry( If_Obj_t *, p->vMapped, pObj, i )
    //        If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( pObj->nRefs == 0 )
                continue;
            If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        }
    }
    else
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // find new delay target
        if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
            p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

        // update the required times according to the target
        if ( p->pPars->DelayTarget != -1 )
        {
            if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
                    Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                }
            }
            else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
//                    Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                }
                p->RequiredGlo = p->pPars->DelayTarget;
            }
        }
        else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
            p->RequiredGlo = p->pPars->DelayTargetNew;

        // do not propagate required times if area minimization is requested
        if ( p->pPars->fAreaOnly ) 
            return;
        // set the required times for the POs
        Tim_ManIncrementTravId( p->pManTim );
        if ( p->vCoAttrs )
        {
            assert( If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs) );
            If_ManForEachCo( p, pObj, i )
            { 
                if ( Vec_IntEntry(p->vCoAttrs, i) == -1 )       // -1=internal
                    continue;
                if ( Vec_IntEntry(p->vCoAttrs, i) == 0 )        //  0=optimize
                    Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 1 )   //  1=keep
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 2 )   //  2=relax
                    Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
                else assert( 0 );
            }
        }
        else if ( p->pPars->fDoAverage )
        {
            if ( p->pPars->nRelaxRatio )
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0 );
            }
            else
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
            }
        }
        else if ( p->pPars->fLatchPaths )
        {
            If_ManForEachPo( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
            If_ManForEachLatchInput( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
        }
        else  
        {
            Tim_ManInitPoRequiredAll( p->pManTim, p->RequiredGlo );
//            If_ManForEachCo( p, pObj, i )
//                Tim_ManSetCoRequired( p->pManTim, pObj->IdPio, p->RequiredGlo );
        }
        // go through the nodes in the reverse topological order
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( If_ObjIsAnd(pObj) )
            {
                if ( pObj->nRefs == 0 )
                    continue;
                If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
            }
            else if ( If_ObjIsCi(pObj) )
            {
                reqTime = pObj->Required;
                Tim_ManSetCiRequired( p->pManTim, pObj->IdPio, reqTime );
            }
            else if ( If_ObjIsCo(pObj) )
            {
                reqTime = Tim_ManGetCoRequired( p->pManTim, pObj->IdPio );
                If_ObjFanin0(pObj)->Required = IF_MIN( reqTime, If_ObjFanin0(pObj)->Required );
            }
            else if ( If_ObjIsConst1(pObj) )
            {
            }
            else // add the node to the mapper
                assert( 0 );
        }
    }
}